

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RepeatedEventControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RepeatedEventControl,slang::ast::Expression_const&,slang::ast::TimingControl&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,TimingControl *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  RepeatedEventControl *pRVar1;
  TimingControl *in_RCX;
  Expression *in_RDX;
  RepeatedEventControl *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pRVar1 = (RepeatedEventControl *)
           allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::RepeatedEventControl::RepeatedEventControl(in_RSI,in_RDX,in_RCX,sourceRange);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }